

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCRetime(Abc_Ntk_t *pNtk,int fVerbose)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  char *pName;
  uint local_70;
  uint local_6c;
  int Count0;
  int Count1;
  int Count2;
  int CountN;
  int iFlop;
  int i;
  Abc_Obj_t *pObjPo;
  Abc_Obj_t *pFlopOut;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  Vec_Int_t *vFlopClassesNew;
  Vec_Int_t *vFlopClasses;
  Vec_Ptr_t *vControls;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pAStack_10;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  Count1 = 0;
  Count0 = 0;
  local_6c = 0;
  local_70 = 0;
  pNtkNew._4_4_ = fVerbose;
  pAStack_10 = pNtk;
  pAStack_10 = Abc_NtkDup(pNtk);
  vFlopClasses = (Vec_Int_t *)Vec_PtrAlloc(100);
  vFlopClassesNew = Vec_IntAlloc(100);
  CountN = 0;
  do {
    iVar2 = Vec_PtrSize(pAStack_10->vBoxes);
    if (iVar2 <= CountN) {
      if (local_6c != 0) {
        uVar3 = Abc_NtkLatchNum(pAStack_10);
        printf("Opposite phase enable is present in %d flops (out of %d).\n",(ulong)local_6c,
               (ulong)uVar3);
      }
      if (pNtkNew._4_4_ != 0) {
        uVar3 = Vec_PtrSize((Vec_Ptr_t *)vFlopClasses);
        printf("CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n",
               (ulong)(uint)Count1,(ulong)(uint)Count0,(ulong)local_6c,(ulong)local_70,(ulong)uVar3)
        ;
      }
      for (CountN = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vFlopClasses), CountN < iVar2;
          CountN = CountN + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vFlopClasses,CountN);
        pAVar7 = Abc_NtkCreatePo(pAStack_10);
        Abc_ObjAddFanin(pAVar7,pAVar4);
        pName = Abc_ObjName(pAVar7);
        Abc_ObjAssignName(pAVar7,pName,(char *)0x0);
        Vec_PtrWriteEntry((Vec_Ptr_t *)vFlopClasses,CountN,pAVar7);
      }
      Abc_NtkOrderCisCos(pAStack_10);
      Abc_NtkCleanup(pAStack_10,pNtkNew._4_4_);
      vControls = (Vec_Ptr_t *)
                  Abc_NtkRetimeWithClassesNtk
                            (pAStack_10,vFlopClassesNew,(Vec_Int_t **)&pObj,pNtkNew._4_4_);
      Abc_NtkTransformBack
                (pAStack_10,(Abc_Ntk_t *)vControls,(Vec_Ptr_t *)vFlopClasses,(Vec_Int_t *)pObj);
      Abc_NtkDelete(pAStack_10);
      Vec_PtrFree((Vec_Ptr_t *)vFlopClasses);
      Vec_IntFree((Vec_Int_t *)pObj);
      return (Abc_Ntk_t *)vControls;
    }
    pAVar4 = Abc_NtkBox(pAStack_10,CountN);
    iVar2 = Abc_ObjIsLatch(pAVar4);
    if (iVar2 != 0) {
      pAVar7 = Abc_ObjFanout0(pAVar4);
      pAVar5 = Abc_ObjFanin0(pAVar4);
      pAVar5 = Abc_ObjFanin0(pAVar5);
      iVar2 = Abc_ObjFaninNum(pAVar5);
      if (iVar2 == 3) {
        pAVar6 = Abc_ObjFanin(pAVar5,1);
        if ((pAVar6 == pAVar7) || (pAVar6 = Abc_ObjFanin(pAVar5,2), pAVar6 == pAVar7)) {
          pAVar6 = Abc_ObjFanin(pAVar5,1);
          if (pAVar6 == pAVar7) {
            Vec_IntPush(vFlopClassesNew,-1);
            local_6c = local_6c + 1;
          }
          else {
            pAVar6 = Abc_ObjFanin(pAVar5,2);
            pVVar1 = vFlopClasses;
            if (pAVar6 != pAVar7) {
              __assert_fail("Abc_ObjFanin(pDriver, 2) == pFlopOut",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLatch.c"
                            ,0x2aa,"Abc_Ntk_t *Abc_NtkCRetime(Abc_Ntk_t *, int)");
            }
            local_70 = local_70 + 1;
            pAVar7 = Abc_ObjFanin0(pAVar5);
            Vec_PtrPushUnique((Vec_Ptr_t *)pVVar1,pAVar7);
            pVVar1 = vFlopClasses;
            pAVar7 = Abc_ObjFanin0(pAVar5);
            iVar2 = Vec_PtrFind((Vec_Ptr_t *)pVVar1,pAVar7);
            Vec_IntPush(vFlopClassesNew,iVar2);
            pAVar4 = Abc_ObjFanin0(pAVar4);
            pAVar7 = Abc_ObjFanin(pAVar5,1);
            Abc_ObjPatchFanin(pAVar4,pAVar5,pAVar7);
          }
        }
        else {
          Vec_IntPush(vFlopClassesNew,-1);
          Count0 = Count0 + 1;
        }
      }
      else {
        Vec_IntPush(vFlopClassesNew,-1);
        Count1 = Count1 + 1;
      }
    }
    CountN = CountN + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkCRetime( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vControls;
    Vec_Int_t * vFlopClasses, * vFlopClassesNew;
    Abc_Obj_t * pObj, * pDriver, * pFlopOut, * pObjPo;
    int i, iFlop, CountN = 0, Count2 = 0, Count1 = 0, Count0 = 0;

    // duplicate the AIG
    pNtk = Abc_NtkDup( pNtk );

    // update registers
    vControls    = Vec_PtrAlloc( 100 );
    vFlopClasses = Vec_IntAlloc( 100 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pFlopOut = Abc_ObjFanout0(pObj);
        pDriver = Abc_ObjFanin0( Abc_ObjFanin0(pObj) );
        if ( Abc_ObjFaninNum(pDriver) != 3 )
        {
            Vec_IntPush( vFlopClasses, -1 );
            CountN++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) != pFlopOut && Abc_ObjFanin(pDriver, 2) != pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count2++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) == pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count1++;
            continue;
        }
        assert( Abc_ObjFanin(pDriver, 2) == pFlopOut );
        Count0++;
        Vec_PtrPushUnique( vControls, Abc_ObjFanin0(pDriver) );
        // set the flop class
        iFlop = Vec_PtrFind( vControls, Abc_ObjFanin0(pDriver) );
        Vec_IntPush( vFlopClasses, iFlop );
        // update
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, Abc_ObjFanin(pDriver, 1) );
    }
    if ( Count1 )
        printf( "Opposite phase enable is present in %d flops (out of %d).\n", Count1, Abc_NtkLatchNum(pNtk) );
    if ( fVerbose )
    printf( "CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n", 
        CountN, Count2, Count1, Count0, Vec_PtrSize(vControls) );

    // add the controls to the list of POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pObjPo, pObj );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
        Vec_PtrWriteEntry( vControls, i, pObjPo );
    }
    Abc_NtkOrderCisCos( pNtk );
    Abc_NtkCleanup( pNtk, fVerbose );

    // performs retiming with classes
    pNtkNew = Abc_NtkRetimeWithClassesNtk( pNtk, vFlopClasses, &vFlopClassesNew, fVerbose );
    Abc_NtkTransformBack( pNtk, pNtkNew, vControls, vFlopClassesNew );
//    assert( Abc_NtkPoNum(pNtkNew) == Abc_NtkPoNum(pNtk) );
    Abc_NtkDelete( pNtk );

    Vec_PtrFree( vControls );
//    Vec_IntFree( vFlopClasses );
    Vec_IntFree( vFlopClassesNew );
    return pNtkNew;
}